

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>::walkFunctionInModule
          (Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_> *this,Function *func
          ,Module *module)

{
  Module *module_local;
  Function *func_local;
  Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_> *this_local;
  
  setModule(this,module);
  setFunction(this,func);
  DataFlowOpts::doWalkFunction((DataFlowOpts *)&this[-1].stack.fixed._M_elems[9].currp,func);
  Visitor<wasm::DataFlowOpts,_void>::visitFunction((Visitor<wasm::DataFlowOpts,_void> *)this,func);
  setFunction(this,(Function *)0x0);
  setModule(this,(Module *)0x0);
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }